

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O0

void duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  void *pvVar4;
  U64 UVar5;
  undefined8 *in_RDI;
  int nbBytes_3;
  int nbBits_3;
  int ctz_3;
  HUF_DEltX2 entry_19;
  int index_19;
  int nbBytes_2;
  int nbBits_2;
  int ctz_2;
  HUF_DEltX2 entry_18;
  int index_18;
  int nbBytes_1;
  int nbBits_1;
  int ctz_1;
  HUF_DEltX2 entry_17;
  int index_17;
  int nbBytes;
  int nbBits;
  int ctz;
  HUF_DEltX2 entry_16;
  int index_16;
  HUF_DEltX2 entry_15;
  int index_15;
  HUF_DEltX2 entry_14;
  int index_14;
  HUF_DEltX2 entry_13;
  int index_13;
  HUF_DEltX2 entry_12;
  int index_12;
  HUF_DEltX2 entry_11;
  int index_11;
  HUF_DEltX2 entry_10;
  int index_10;
  HUF_DEltX2 entry_9;
  int index_9;
  HUF_DEltX2 entry_8;
  int index_8;
  HUF_DEltX2 entry_7;
  int index_7;
  HUF_DEltX2 entry_6;
  int index_6;
  HUF_DEltX2 entry_5;
  int index_5;
  HUF_DEltX2 entry_4;
  int index_4;
  HUF_DEltX2 entry_3;
  int index_3;
  HUF_DEltX2 entry_2;
  int index_2;
  HUF_DEltX2 entry_1;
  int index_1;
  HUF_DEltX2 entry;
  int index;
  size_t oiters;
  size_t iters;
  int stream;
  BYTE *olimit;
  BYTE *ilowest;
  HUF_DEltX2 *dtable;
  BYTE *oend [4];
  BYTE *op [4];
  BYTE *ip [4];
  U64 bits [4];
  ulong local_190;
  U16 local_17c;
  byte bStack_17a;
  U16 local_168;
  byte bStack_166;
  U16 local_154;
  byte bStack_152;
  U16 local_140;
  byte bStack_13e;
  U16 local_138;
  byte bStack_136;
  U16 local_130;
  byte bStack_12e;
  U16 local_128;
  byte bStack_126;
  U16 local_120;
  byte bStack_11e;
  U16 local_118;
  byte bStack_116;
  U16 local_110;
  byte bStack_10e;
  U16 local_108;
  byte bStack_106;
  U16 local_100;
  byte bStack_fe;
  U16 local_f8;
  byte bStack_f6;
  U16 local_f0;
  byte bStack_ee;
  U16 local_e8;
  byte bStack_e6;
  U16 local_e0;
  byte bStack_de;
  U16 local_d8;
  byte bStack_d6;
  U16 local_d0;
  byte bStack_ce;
  U16 local_c8;
  byte bStack_c6;
  U16 local_c0;
  byte bStack_be;
  ulong local_b0;
  int local_a4;
  void *local_88 [4];
  void *local_68 [4];
  void *local_48 [4];
  U64 local_28;
  U64 local_20;
  U64 local_18;
  U64 local_10;
  undefined8 *local_8;
  
  lVar1 = in_RDI[0xc];
  lVar2 = in_RDI[0xd];
  local_28 = in_RDI[8];
  local_20 = in_RDI[9];
  local_18 = in_RDI[10];
  local_10 = in_RDI[0xb];
  local_48[0] = (void *)*in_RDI;
  local_48[1] = (void *)in_RDI[1];
  local_48[2] = (void *)in_RDI[2];
  local_48[3] = (void *)in_RDI[3];
  local_68[0] = (void *)in_RDI[4];
  local_68[1] = (void *)in_RDI[5];
  local_68[2] = (void *)in_RDI[6];
  local_68[3] = (void *)in_RDI[7];
  local_88[0] = (void *)in_RDI[5];
  local_88[1] = (void *)in_RDI[6];
  local_88[2] = (void *)in_RDI[7];
  local_88[3] = (void *)in_RDI[0xe];
  local_8 = in_RDI;
  while( true ) {
    local_b0 = (ulong)((long)local_48[0] - lVar2) / 7;
    for (local_a4 = 0; local_a4 < 4; local_a4 = local_a4 + 1) {
      local_190 = (ulong)((long)local_88[local_a4] - (long)local_68[local_a4]) / 10;
      if (local_b0 < local_190) {
        local_190 = local_b0;
      }
      local_b0 = local_190;
    }
    pvVar4 = (void *)((long)local_68[3] + local_b0 * 5);
    if (local_68[3] == pvVar4) break;
    for (local_a4 = 1; local_a4 < 4; local_a4 = local_a4 + 1) {
      if (local_48[local_a4] < local_48[local_a4 + -1]) goto LAB_029c7d4c;
    }
    do {
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_28 >> 0x35) * 4);
      local_c0 = (U16)uVar3;
      MEM_write16(local_68[0],local_c0);
      bStack_be = (byte)(uVar3 >> 0x10);
      local_28 = local_28 << (bStack_be & 0x3f);
      local_68[0] = (void *)((long)local_68[0] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_20 >> 0x35) * 4);
      local_c8 = (U16)uVar3;
      MEM_write16(local_68[1],local_c8);
      bStack_c6 = (byte)(uVar3 >> 0x10);
      local_20 = local_20 << (bStack_c6 & 0x3f);
      local_68[1] = (void *)((long)local_68[1] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_18 >> 0x35) * 4);
      local_d0 = (U16)uVar3;
      MEM_write16(local_68[2],local_d0);
      bStack_ce = (byte)(uVar3 >> 0x10);
      local_18 = local_18 << (bStack_ce & 0x3f);
      local_68[2] = (void *)((long)local_68[2] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_28 >> 0x35) * 4);
      local_d8 = (U16)uVar3;
      MEM_write16(local_68[0],local_d8);
      bStack_d6 = (byte)(uVar3 >> 0x10);
      local_28 = local_28 << (bStack_d6 & 0x3f);
      local_68[0] = (void *)((long)local_68[0] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_20 >> 0x35) * 4);
      local_e0 = (U16)uVar3;
      MEM_write16(local_68[1],local_e0);
      bStack_de = (byte)(uVar3 >> 0x10);
      local_20 = local_20 << (bStack_de & 0x3f);
      local_68[1] = (void *)((long)local_68[1] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_18 >> 0x35) * 4);
      local_e8 = (U16)uVar3;
      MEM_write16(local_68[2],local_e8);
      bStack_e6 = (byte)(uVar3 >> 0x10);
      local_18 = local_18 << (bStack_e6 & 0x3f);
      local_68[2] = (void *)((long)local_68[2] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_28 >> 0x35) * 4);
      local_f0 = (U16)uVar3;
      MEM_write16(local_68[0],local_f0);
      bStack_ee = (byte)(uVar3 >> 0x10);
      local_28 = local_28 << (bStack_ee & 0x3f);
      local_68[0] = (void *)((long)local_68[0] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_20 >> 0x35) * 4);
      local_f8 = (U16)uVar3;
      MEM_write16(local_68[1],local_f8);
      bStack_f6 = (byte)(uVar3 >> 0x10);
      local_20 = local_20 << (bStack_f6 & 0x3f);
      local_68[1] = (void *)((long)local_68[1] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_18 >> 0x35) * 4);
      local_100 = (U16)uVar3;
      MEM_write16(local_68[2],local_100);
      bStack_fe = (byte)(uVar3 >> 0x10);
      local_18 = local_18 << (bStack_fe & 0x3f);
      local_68[2] = (void *)((long)local_68[2] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_28 >> 0x35) * 4);
      local_108 = (U16)uVar3;
      MEM_write16(local_68[0],local_108);
      bStack_106 = (byte)(uVar3 >> 0x10);
      local_28 = local_28 << (bStack_106 & 0x3f);
      local_68[0] = (void *)((long)local_68[0] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_20 >> 0x35) * 4);
      local_110 = (U16)uVar3;
      MEM_write16(local_68[1],local_110);
      bStack_10e = (byte)(uVar3 >> 0x10);
      local_20 = local_20 << (bStack_10e & 0x3f);
      local_68[1] = (void *)((long)local_68[1] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_18 >> 0x35) * 4);
      local_118 = (U16)uVar3;
      MEM_write16(local_68[2],local_118);
      bStack_116 = (byte)(uVar3 >> 0x10);
      local_18 = local_18 << (bStack_116 & 0x3f);
      local_68[2] = (void *)((long)local_68[2] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_28 >> 0x35) * 4);
      local_120 = (U16)uVar3;
      MEM_write16(local_68[0],local_120);
      bStack_11e = (byte)(uVar3 >> 0x10);
      local_28 = local_28 << (bStack_11e & 0x3f);
      local_68[0] = (void *)((long)local_68[0] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_20 >> 0x35) * 4);
      local_128 = (U16)uVar3;
      MEM_write16(local_68[1],local_128);
      bStack_126 = (byte)(uVar3 >> 0x10);
      local_20 = local_20 << (bStack_126 & 0x3f);
      local_68[1] = (void *)((long)local_68[1] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_18 >> 0x35) * 4);
      local_130 = (U16)uVar3;
      MEM_write16(local_68[2],local_130);
      bStack_12e = (byte)(uVar3 >> 0x10);
      local_18 = local_18 << (bStack_12e & 0x3f);
      local_68[2] = (void *)((long)local_68[2] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_10 >> 0x35) * 4);
      local_138 = (U16)uVar3;
      MEM_write16(local_68[3],local_138);
      bStack_136 = (byte)(uVar3 >> 0x10);
      local_10 = local_10 << (bStack_136 & 0x3f);
      local_68[3] = (void *)((long)local_68[3] + (long)(int)(uVar3 >> 0x18));
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_10 >> 0x35) * 4);
      local_140 = (U16)uVar3;
      MEM_write16(local_68[3],local_140);
      bStack_13e = (byte)(uVar3 >> 0x10);
      local_10 = local_10 << (bStack_13e & 0x3f);
      local_68[3] = (void *)((long)local_68[3] + (long)(int)(uVar3 >> 0x18));
      uVar3 = ZSTD_countTrailingZeros64(local_28);
      local_48[0] = (void *)((long)local_48[0] - (long)((int)uVar3 >> 3));
      UVar5 = MEM_read64(local_48[0]);
      local_28 = (UVar5 | 1) << ((byte)uVar3 & 7);
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_10 >> 0x35) * 4);
      local_154 = (U16)uVar3;
      MEM_write16(local_68[3],local_154);
      bStack_152 = (byte)(uVar3 >> 0x10);
      local_10 = local_10 << (bStack_152 & 0x3f);
      local_68[3] = (void *)((long)local_68[3] + (long)(int)(uVar3 >> 0x18));
      uVar3 = ZSTD_countTrailingZeros64(local_20);
      local_48[1] = (void *)((long)local_48[1] - (long)((int)uVar3 >> 3));
      UVar5 = MEM_read64(local_48[1]);
      local_20 = (UVar5 | 1) << ((byte)uVar3 & 7);
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_10 >> 0x35) * 4);
      local_168 = (U16)uVar3;
      MEM_write16(local_68[3],local_168);
      bStack_166 = (byte)(uVar3 >> 0x10);
      local_10 = local_10 << (bStack_166 & 0x3f);
      local_68[3] = (void *)((long)local_68[3] + (long)(int)(uVar3 >> 0x18));
      uVar3 = ZSTD_countTrailingZeros64(local_18);
      local_48[2] = (void *)((long)local_48[2] - (long)((int)uVar3 >> 3));
      UVar5 = MEM_read64(local_48[2]);
      local_18 = (UVar5 | 1) << ((byte)uVar3 & 7);
      uVar3 = *(uint *)(lVar1 + (long)(int)(uint)(local_10 >> 0x35) * 4);
      local_17c = (U16)uVar3;
      MEM_write16(local_68[3],local_17c);
      bStack_17a = (byte)(uVar3 >> 0x10);
      local_10 = local_10 << (bStack_17a & 0x3f);
      local_68[3] = (void *)((long)local_68[3] + (long)(int)(uVar3 >> 0x18));
      uVar3 = ZSTD_countTrailingZeros64(local_10);
      local_48[3] = (void *)((long)local_48[3] - (long)((int)uVar3 >> 3));
      UVar5 = MEM_read64(local_48[3]);
      local_10 = (UVar5 | 1) << ((byte)uVar3 & 7);
    } while (local_68[3] < pvVar4);
  }
LAB_029c7d4c:
  local_8[8] = local_28;
  local_8[9] = local_20;
  local_8[10] = local_18;
  local_8[0xb] = local_10;
  *local_8 = local_48[0];
  local_8[1] = local_48[1];
  local_8[2] = local_48[2];
  local_8[3] = local_48[3];
  local_8[4] = local_68[0];
  local_8[5] = local_68[1];
  local_8[6] = local_68[2];
  local_8[7] = local_68[3];
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilowest) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X2_DECODE_SYMBOL(_stream, _decode3)                      \
    do {                                                              \
        if ((_decode3) || (_stream) != 3) {                           \
            int const index = (int)(bits[(_stream)] >> 53);           \
            HUF_DEltX2 const entry = dtable[index];                   \
            MEM_write16(op[(_stream)], entry.sequence); \
            bits[(_stream)] <<= (entry.nbBits) & 0x3F;                \
            op[(_stream)] += (entry.length);                          \
        }                                                             \
    } while (0)

#define HUF_4X2_RELOAD_STREAM(_stream)                                  \
    do {                                                                \
        HUF_4X2_DECODE_SYMBOL(3, 1);                                    \
        {                                                               \
            int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
            int const nbBits = ctz & 7;                                 \
            int const nbBytes = ctz >> 3;                               \
            ip[(_stream)] -= nbBytes;                                   \
            bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
            bits[(_stream)] <<= nbBits;                                 \
        }                                                               \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols from each of the first 3 streams.
             * The final stream will be decoded during the reload phase
             * to reduce register pressure.
             */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);

            /* Decode one symbol from the final stream */
            HUF_4X2_DECODE_SYMBOL(3, 1);

            /* Decode 4 symbols from the final stream & reload bitstreams.
             * The final stream is reloaded last, meaning that all 5 symbols
             * are decoded from the final stream before it is reloaded.
             */
            HUF_4X_FOR_EACH_STREAM(HUF_4X2_RELOAD_STREAM);
        } while (op[3] < olimit);
    }

#undef HUF_4X2_DECODE_SYMBOL
#undef HUF_4X2_RELOAD_STREAM

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}